

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O2

void __thiscall
sglr::GLContext::genRenderbuffers(GLContext *this,int numRenderbuffers,deUint32 *renderbuffers)

{
  glu::CallLogWrapper::glGenRenderbuffers(this->m_wrapper,numRenderbuffers,renderbuffers);
  if (0 < numRenderbuffers) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_range_unique<unsigned_int*>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->m_allocatedRbos,renderbuffers,renderbuffers + (uint)numRenderbuffers);
    return;
  }
  return;
}

Assistant:

void GLContext::genRenderbuffers (int numRenderbuffers, deUint32* renderbuffers)
{
	m_wrapper->glGenRenderbuffers(numRenderbuffers, renderbuffers);
	if (numRenderbuffers > 0)
		m_allocatedRbos.insert(renderbuffers, renderbuffers+numRenderbuffers);
}